

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_fmov(DisasContext_conflict1 *s,int rd,int rn,int type,_Bool itof)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGTemp *ts;
  uint32_t oprsz;
  TCGv_ptr a2;
  int iVar2;
  TCGv_i64 ret;
  TCGOpcode opc;
  undefined7 in_register_00000081;
  TCGArg a3;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((int)CONCAT71(in_register_00000081,itof) != 0) {
    pTVar1 = cpu_reg_aarch64(s,rn);
    switch(type) {
    case 0:
      ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
      tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,pTVar1);
      break;
    case 1:
      write_fp_dreg_aarch64(s,rd,pTVar1);
      return;
    case 2:
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(rd * 0x100 + 0xc18));
      if ((uint)s->sve_len < 0x11) {
        return;
      }
      oprsz = s->sve_len - 0x10;
      tcg_gen_gvec_dup8i_aarch64(s->uc->tcg_ctx,rd * 0x100 + 0xc20,oprsz,oprsz,'\0');
      return;
    case 3:
      ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
      tcg_gen_ext16u_i64_aarch64(tcg_ctx,ret,pTVar1);
      break;
    default:
      iVar2 = 0x1b23;
      goto LAB_006a4d8e;
    }
    write_fp_dreg_aarch64(s,rd,ret);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    return;
  }
  pTVar1 = cpu_reg_aarch64(s,rd);
  switch(type) {
  case 0:
    a3 = (TCGArg)(rn * 0x100 + 0xc10);
    a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
    opc = INDEX_op_ld32u_i64;
    goto LAB_006a4d4f;
  case 1:
    iVar2 = rn * 0x100 + 0xc10;
    break;
  case 2:
    iVar2 = rn * 0x100 + 0xc18;
    break;
  case 3:
    a3 = (TCGArg)(rn * 0x100 + 0xc10);
    a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
    opc = INDEX_op_ld16u_i64;
    goto LAB_006a4d4f;
  default:
    iVar2 = 0x1b3a;
LAB_006a4d8e:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,iVar2,(char *)0x0);
  }
  a3 = (TCGArg)iVar2;
  a2 = tcg_ctx->cpu_env + (long)tcg_ctx;
  opc = INDEX_op_ld_i64;
LAB_006a4d4f:
  tcg_gen_op3_aarch64(tcg_ctx,opc,(TCGArg)(pTVar1 + (long)tcg_ctx),(TCGArg)a2,a3);
  return;
}

Assistant:

static void handle_fmov(DisasContext *s, int rd, int rn, int type, bool itof)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* FMOV: gpr to or from float, double, or top half of quad fp reg,
     * without conversion.
     */

    if (itof) {
        TCGv_i64 tcg_rn = cpu_reg(s, rn);
        TCGv_i64 tmp;

        switch (type) {
        case 0:
            /* 32 bit */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ext32u_i64(tcg_ctx, tmp, tcg_rn);
            write_fp_dreg(s, rd, tmp);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        case 1:
            /* 64 bit */
            write_fp_dreg(s, rd, tcg_rn);
            break;
        case 2:
            /* 64 bit to top half. */
            tcg_gen_st_i64(tcg_ctx, tcg_rn, tcg_ctx->cpu_env, fp_reg_hi_offset(s, rd));
            clear_vec_high(s, true, rd);
            break;
        case 3:
            /* 16 bit */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ext16u_i64(tcg_ctx, tmp, tcg_rn);
            write_fp_dreg(s, rd, tmp);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        TCGv_i64 tcg_rd = cpu_reg(s, rd);

        switch (type) {
        case 0:
            /* 32 bit */
            tcg_gen_ld32u_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_32));
            break;
        case 1:
            /* 64 bit */
            tcg_gen_ld_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_64));
            break;
        case 2:
            /* 64 bits from top half */
            tcg_gen_ld_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_hi_offset(s, rn));
            break;
        case 3:
            /* 16 bit */
            tcg_gen_ld16u_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_16));
            break;
        default:
            g_assert_not_reached();
        }
    }
}